

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O0

void __thiscall Timidity::GF1Envelope::ApplyToAmp(GF1Envelope *this,Voice *v)

{
  double dVar1;
  double final_amp;
  double env_vol;
  Voice *v_local;
  GF1Envelope *this_local;
  
  final_amp = (double)v->attenuation;
  if (v->tremolo_phase_increment != 0) {
    final_amp = (double)v->tremolo_volume * final_amp;
  }
  dVar1 = pow(2.0,(double)((float)this->volume / 1.0737418e+09) * final_amp * 16.0 - 16.0);
  v->left_mix = (float)(dVar1 * 0.5 * (double)v->left_offset);
  v->right_mix = (float)(dVar1 * 0.5 * (double)v->right_offset);
  return;
}

Assistant:

void GF1Envelope::ApplyToAmp(Voice *v)
{
	double env_vol = v->attenuation;
	double final_amp;

	final_amp = FINAL_MIX_SCALE;
	if (v->tremolo_phase_increment != 0)
	{ // [RH] FIXME: This is wrong. Tremolo should offset the
	  // envelope volume, not scale it.
		env_vol *= v->tremolo_volume;
	}
	env_vol *= volume / float(1 << 30);
	env_vol = calc_gf1_amp(env_vol);
	env_vol *= final_amp;
	v->left_mix = float(env_vol * v->left_offset);
	v->right_mix = float(env_vol * v->right_offset);
}